

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String Bstrlib::operator+(tagbstring *x,String *b)

{
  uchar *extraout_RDX;
  String SVar2;
  String SStack_28;
  uchar *puVar1;
  
  String::String(&SStack_28,&b->super_tagbstring);
  SVar2 = String::operator+((String *)x,&SStack_28);
  puVar1 = SVar2.super_tagbstring.data;
  if (SStack_28.super_tagbstring.data != (uchar *)0x0) {
    free(SStack_28.super_tagbstring.data);
    puVar1 = extraout_RDX;
  }
  SVar2.super_tagbstring.data = puVar1;
  SVar2.super_tagbstring._0_8_ = x;
  return (String)SVar2.super_tagbstring;
}

Assistant:

const String operator+(const tagbstring& x, const String& b)
    {
        return String(x) + b;
    }